

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

wasm_func_t * wasm_func_new(wasm_store_t *store,wasm_functype_t *type,wasm_func_callback_t callback)

{
  ExternType *pEVar1;
  wasm_func_t *this;
  _func_void *p_Var2;
  FuncType wabt_type;
  anon_class_80_3_e2e6609b lambda;
  RefPtr<wabt::interp::HostFunc> local_168;
  RefPtr<wabt::interp::Func> local_148;
  FuncType local_128;
  undefined **local_e8;
  ExternKind local_e0;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_d8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_c0;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  wasm_store_t *local_80;
  undefined **local_78;
  ExternKind local_70;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_68;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_50;
  wasm_func_callback_t local_38;
  
  pEVar1 = (type->super_wasm_externtype_t).I._M_t.
           super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
           .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
  local_e0 = pEVar1->kind;
  if (local_e0 == First) {
    local_e8 = &PTR__FuncType_00247890;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              (&local_d8,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)(pEVar1 + 1));
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              (&local_c0,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)&pEVar1[2].kind);
    local_70 = local_e0;
    local_78 = &PTR__FuncType_00247890;
    local_80 = store;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_68,&local_d8);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_50,&local_c0);
    local_38 = callback;
    this = (wasm_func_t *)operator_new(0x18);
    local_128.super_ExternType.kind = local_e0;
    local_128.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00247890;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_128.params,&local_d8);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_128.results,&local_c0);
    local_98 = (code *)0x0;
    pcStack_90 = (code *)0x0;
    local_a8._M_unused._M_object = (void *)0x0;
    local_a8._8_8_ = 0;
    p_Var2 = (_func_void *)operator_new(0x50);
    *(wasm_store_t **)p_Var2 = local_80;
    *(undefined ***)(p_Var2 + 8) = &PTR__ExternType_00247560;
    *(ExternKind *)(p_Var2 + 0x10) = local_70;
    *(undefined ***)(p_Var2 + 8) = &PTR__FuncType_00247890;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(p_Var2 + 0x18),&local_68);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(p_Var2 + 0x30),&local_50);
    *(wasm_func_callback_t *)(p_Var2 + 0x48) = local_38;
    pcStack_90 = std::
                 _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp-wasm-c-api.cc:795:17)>
                 ::_M_invoke;
    local_98 = std::
               _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp-wasm-c-api.cc:795:17)>
               ::_M_manager;
    local_a8._M_unused._0_8_ = (undefined8)p_Var2;
    wabt::interp::Store::
    Alloc<wabt::interp::HostFunc,wabt::interp::Store&,wabt::interp::FuncType&,std::function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>&>
              (&local_168,&store->I,&store->I,&local_128,
               (function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
                *)&local_a8);
    local_148.obj_ = &(local_168.obj_)->super_Func;
    local_148.store_ = local_168.store_;
    if (local_168.store_ == (Store *)0x0) {
      local_148.root_index_ = 0;
    }
    else {
      local_148.root_index_ = wabt::interp::Store::CopyRoot(local_168.store_,local_168.root_index_);
    }
    wasm_func_t::wasm_func_t(this,&local_148);
    if ((HostFunc *)local_148.obj_ != (HostFunc *)0x0) {
      wabt::interp::Store::DeleteRoot(local_148.store_,local_148.root_index_);
      local_148.obj_ = (Func *)0x0;
      local_148.store_ = (Store *)0x0;
      local_148.root_index_ = 0;
    }
    if (local_168.obj_ != (HostFunc *)0x0) {
      wabt::interp::Store::DeleteRoot(local_168.store_,local_168.root_index_);
      local_168.obj_ = (HostFunc *)0x0;
      local_168.store_ = (Store *)0x0;
      local_168.root_index_ = 0;
    }
    if (local_98 != (code *)0x0) {
      (*local_98)(&local_a8,&local_a8,__destroy_functor);
    }
    local_128.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00247890;
    if (local_128.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_128.results.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.results.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_128.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_128.params.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.params.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_78 = &PTR__FuncType_00247890;
    if (local_50.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_e8 = &PTR__FuncType_00247890;
    if (local_c0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return this;
  }
  __assert_fail("isa<Derived>(base)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                ,0x4e,
                "Derived *wabt::cast(Base *) [Derived = wabt::interp::FuncType, Base = wabt::interp::ExternType]"
               );
}

Assistant:

own wasm_func_t* wasm_func_new(wasm_store_t* store,
                               const wasm_functype_t* type,
                               wasm_func_callback_t callback) {
  FuncType wabt_type = *type->As<FuncType>();
  auto lambda = [=](Thread& thread, const Values& wabt_params,
                    Values& wabt_results, Trap::Ptr* out_trap) -> Result {
    wasm_val_vec_t params, results;
    wasm_val_vec_new_uninitialized(&params, wabt_params.size());
    wasm_val_vec_new_uninitialized(&results, wabt_results.size());
    FromWabtValues(store->I, &params, wabt_type.params, wabt_params);
    auto trap = callback(&params, &results);
    wasm_val_vec_delete(&params);
    if (trap) {
      *out_trap = trap->I.As<Trap>();
      wasm_trap_delete(trap);
      // Can't use wasm_val_vec_delete since it wasn't populated.
      delete[] results.data;
      return Result::Error;
    }
    wabt_results = ToWabtValues(&results);
    wasm_val_vec_delete(&results);
    return Result::Ok;
  };

  return new wasm_func_t{HostFunc::New(store->I, wabt_type, lambda)};
}